

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

void store_host_key(char *hostname,int port,char *keytype,char *key)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  char *pcVar2;
  FILE *__stream_00;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  int *piVar6;
  
  __filename = make_filename(2,(char *)0x0);
  __stream = fopen(__filename,"w");
  if (__stream == (FILE *)0x0) {
    piVar6 = __errno_location();
    iVar1 = *piVar6;
    if (iVar1 == 2) {
      pcVar2 = make_filename(0,(char *)0x0);
      pcVar3 = make_dir_path(pcVar2,0x1c0);
      if (pcVar3 != (char *)0x0) {
        nonfatal("Unable to store host key: %s",pcVar3);
        safefree(pcVar3);
        safefree(pcVar2);
        goto LAB_0010ee1f;
      }
      safefree(pcVar2);
      __stream = fopen(__filename,"w");
      if (__stream != (FILE *)0x0) goto LAB_0010ec70;
      iVar1 = *piVar6;
    }
    pcVar2 = strerror(iVar1);
    nonfatal("Unable to store host key: open(\"%s\") returned \'%s\'",__filename,pcVar2);
  }
  else {
LAB_0010ec70:
    pcVar2 = make_filename(1,(char *)0x0);
    __stream_00 = fopen(pcVar2,"r");
    pcVar3 = dupprintf("%s@%d:%s %s\n",keytype,(ulong)(uint)port,hostname,key);
    sVar4 = strcspn(pcVar3," ");
    if (__stream_00 != (FILE *)0x0) {
      pcVar5 = fgetline((FILE *)__stream_00);
      if (pcVar5 != (char *)0x0) {
        do {
          iVar1 = strncmp(pcVar5,pcVar3,(long)((int)sVar4 + 1));
          if (iVar1 != 0) {
            fputs(pcVar5,__stream);
          }
          safefree(pcVar5);
          pcVar5 = fgetline((FILE *)__stream_00);
        } while (pcVar5 != (char *)0x0);
      }
      fclose(__stream_00);
    }
    fputs(pcVar3,__stream);
    fclose(__stream);
    iVar1 = rename(__filename,pcVar2);
    if (iVar1 < 0) {
      piVar6 = __errno_location();
      pcVar5 = strerror(*piVar6);
      nonfatal("Unable to store host key: rename(\"%s\",\"%s\") returned \'%s\'",__filename,pcVar2,
               pcVar5);
    }
    safefree(__filename);
    safefree(pcVar2);
    __filename = pcVar3;
  }
LAB_0010ee1f:
  safefree(__filename);
  return;
}

Assistant:

void store_host_key(const char *hostname, int port,
                    const char *keytype, const char *key)
{
    FILE *rfp, *wfp;
    char *newtext, *line;
    int headerlen;
    char *filename, *tmpfilename;

    /*
     * Open both the old file and a new file.
     */
    tmpfilename = make_filename(INDEX_HOSTKEYS_TMP, NULL);
    wfp = fopen(tmpfilename, "w");
    if (!wfp && errno == ENOENT) {
        char *dir, *errmsg;

        dir = make_filename(INDEX_DIR, NULL);
        if ((errmsg = make_dir_path(dir, 0700)) != NULL) {
            nonfatal("Unable to store host key: %s", errmsg);
            sfree(errmsg);
            sfree(dir);
            sfree(tmpfilename);
            return;
        }
        sfree(dir);

        wfp = fopen(tmpfilename, "w");
    }
    if (!wfp) {
        nonfatal("Unable to store host key: open(\"%s\") "
                 "returned '%s'", tmpfilename, strerror(errno));
        sfree(tmpfilename);
        return;
    }
    filename = make_filename(INDEX_HOSTKEYS, NULL);
    rfp = fopen(filename, "r");

    newtext = dupprintf("%s@%d:%s %s\n", keytype, port, hostname, key);
    headerlen = 1 + strcspn(newtext, " ");   /* count the space too */

    /*
     * Copy all lines from the old file to the new one that _don't_
     * involve the same host key identifier as the one we're adding.
     */
    if (rfp) {
        while ( (line = fgetline(rfp)) ) {
            if (strncmp(line, newtext, headerlen))
                fputs(line, wfp);
            sfree(line);
        }
        fclose(rfp);
    }

    /*
     * Now add the new line at the end.
     */
    fputs(newtext, wfp);

    fclose(wfp);

    if (rename(tmpfilename, filename) < 0) {
        nonfatal("Unable to store host key: rename(\"%s\",\"%s\")"
                 " returned '%s'", tmpfilename, filename,
                 strerror(errno));
    }

    sfree(tmpfilename);
    sfree(filename);
    sfree(newtext);
}